

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Parser
cm_expat_XML_ParserCreate_MM
          (XML_Char *encodingName,XML_Memory_Handling_Suite *memsuite,XML_Char *nameSep)

{
  int iVar1;
  _func_void_void_ptr *p_Var2;
  ENCODING *pEVar3;
  _func_void_void_ptr *local_48;
  XML_Memory_Handling_Suite *mtemp_1;
  XML_Memory_Handling_Suite *mtemp;
  XML_Parser parser;
  XML_Char *nameSep_local;
  XML_Memory_Handling_Suite *memsuite_local;
  XML_Char *encodingName_local;
  
  if (memsuite == (XML_Memory_Handling_Suite *)0x0) {
    mtemp = (XML_Memory_Handling_Suite *)malloc(0x498);
    mtemp[1].malloc_fcn = malloc;
    mtemp[1].realloc_fcn = realloc;
    mtemp[1].free_fcn = free;
  }
  else {
    mtemp = (XML_Memory_Handling_Suite *)(*memsuite->malloc_fcn)(0x498);
    mtemp[1].malloc_fcn = memsuite->malloc_fcn;
    mtemp[1].realloc_fcn = memsuite->realloc_fcn;
    mtemp[1].free_fcn = memsuite->free_fcn;
  }
  if (mtemp == (XML_Memory_Handling_Suite *)0x0) {
    encodingName_local = (XML_Char *)mtemp;
  }
  else {
    mtemp[0x15].free_fcn = prologInitProcessor;
    cm_expat_XmlPrologStateInit((PROLOG_STATE *)&mtemp[0x14].free_fcn);
    mtemp->malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp->realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[4].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[4].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[5].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[5].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[5].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[6].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[6].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[6].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[7].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[7].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[7].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[8].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[8].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[8].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[9].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[9].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[9].free_fcn = (_func_void_void_ptr *)mtemp;
    mtemp[10].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[10].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[10].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[0xb].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[0xb].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp->free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[2].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[2].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[3].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[3].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[2].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[0x1a].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[0x1a].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[0x18].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[0x18].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[0x18].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[0x19].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[0x19].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[0x19].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[0x1a].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    memset(mtemp + 0x2b,0,0x10);
    *(undefined4 *)&mtemp[0x16].malloc_fcn = 0;
    mtemp[0x16].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[0x16].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[0x17].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[0x17].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    *(undefined4 *)((long)&mtemp[0x17].free_fcn + 4) = 0;
    mtemp[0x28].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[0x29].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    mtemp[0x29].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[0x29].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    *(undefined4 *)&mtemp[0x2a].malloc_fcn = 0x10;
    p_Var2 = (_func_void_void_ptr *)
             (*mtemp[1].malloc_fcn)((long)*(int *)&mtemp[0x2a].malloc_fcn << 5);
    mtemp[0x2a].free_fcn = p_Var2;
    *(undefined4 *)((long)&mtemp[0x2a].malloc_fcn + 4) = 0;
    p_Var2 = (_func_void_void_ptr *)(*mtemp[1].malloc_fcn)(0x400);
    mtemp[3].free_fcn = p_Var2;
    *(undefined4 *)&mtemp[0x30].malloc_fcn = 0;
    mtemp[0x2f].free_fcn = (_func_void_void_ptr *)0x0;
    *(undefined4 *)((long)&mtemp[0x30].malloc_fcn + 4) = 0;
    mtemp[0x13].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[0x14].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    mtemp[0x13].free_fcn = (_func_void_void_ptr *)0x0;
    mtemp[0x14].malloc_fcn = (_func_void_ptr_size_t *)0x0;
    *(undefined1 *)&mtemp[0x30].realloc_fcn = 0x21;
    mtemp[0x30].free_fcn = (_func_void_void_ptr *)0x0;
    *(undefined4 *)((long)&mtemp[0x30].realloc_fcn + 4) = 0;
    *(undefined4 *)&mtemp[0x13].malloc_fcn = 0;
    *(undefined4 *)((long)&mtemp[0x13].malloc_fcn + 4) = 0;
    poolInit((STRING_POOL *)&mtemp[0x2b].free_fcn,mtemp + 1);
    poolInit((STRING_POOL *)&mtemp[0x2d].free_fcn,mtemp + 1);
    if (encodingName == (XML_Char *)0x0) {
      local_48 = (_func_void_void_ptr *)0x0;
    }
    else {
      local_48 = (_func_void_void_ptr *)
                 poolCopyString((STRING_POOL *)&mtemp[0x2b].free_fcn,encodingName);
    }
    mtemp[0x12].free_fcn = local_48;
    mtemp[0x28].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)0x0;
    iVar1 = dtdInit((DTD *)&mtemp[0x1b].realloc_fcn,mtemp);
    if ((((iVar1 == 0) || (mtemp[0x2a].free_fcn == (_func_void_void_ptr *)0x0)) ||
        (mtemp[3].free_fcn == (_func_void_void_ptr *)0x0)) ||
       ((encodingName != (XML_Char *)0x0 && (mtemp[0x12].free_fcn == (_func_void_void_ptr *)0x0))))
    {
      cm_expat_XML_ParserFree(mtemp);
      encodingName_local = (XML_Char *)0x0;
    }
    else {
      mtemp[4].malloc_fcn = (_func_void_ptr_size_t *)(mtemp[3].free_fcn + 0x400);
      if (nameSep == (XML_Char *)0x0) {
        cm_expat_XmlInitEncoding
                  ((INIT_ENCODING *)(mtemp + 0xc),(ENCODING **)&mtemp[0xb].free_fcn,(char *)0x0);
        pEVar3 = cm_expat_XmlGetUtf8InternalEncoding();
        mtemp[0x12].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)pEVar3;
      }
      else {
        cm_expat_XmlInitEncodingNS
                  ((INIT_ENCODING *)(mtemp + 0xc),(ENCODING **)&mtemp[0xb].free_fcn,(char *)0x0);
        *(undefined4 *)&mtemp[0x13].malloc_fcn = 1;
        pEVar3 = cm_expat_XmlGetUtf8InternalEncodingNS();
        mtemp[0x12].realloc_fcn = (_func_void_ptr_void_ptr_size_t *)pEVar3;
        *(XML_Char *)&mtemp[0x30].realloc_fcn = *nameSep;
        iVar1 = setContext(mtemp,"xml=http://www.w3.org/XML/1998/namespace");
        if (iVar1 == 0) {
          cm_expat_XML_ParserFree(mtemp);
          return (XML_Parser)0x0;
        }
      }
      encodingName_local = (XML_Char *)mtemp;
    }
  }
  return encodingName_local;
}

Assistant:

XML_Parser
XML_ParserCreate_MM(const XML_Char *encodingName,
                    const XML_Memory_Handling_Suite *memsuite,
                    const XML_Char *nameSep) {
  
  XML_Parser parser;
  static
  const XML_Char implicitContext[] = {
    XML_T('x'), XML_T('m'), XML_T('l'), XML_T('='),
    XML_T('h'), XML_T('t'), XML_T('t'), XML_T('p'), XML_T(':'),
    XML_T('/'), XML_T('/'), XML_T('w'), XML_T('w'), XML_T('w'),
    XML_T('.'), XML_T('w'), XML_T('3'),
    XML_T('.'), XML_T('o'), XML_T('r'), XML_T('g'),
    XML_T('/'), XML_T('X'), XML_T('M'), XML_T('L'),
    XML_T('/'), XML_T('1'), XML_T('9'), XML_T('9'), XML_T('8'),
    XML_T('/'), XML_T('n'), XML_T('a'), XML_T('m'), XML_T('e'),
    XML_T('s'), XML_T('p'), XML_T('a'), XML_T('c'), XML_T('e'),
    XML_T('\0')
  };


  if (memsuite) {
    XML_Memory_Handling_Suite *mtemp;
    parser = memsuite->malloc_fcn(sizeof(Parser));
    mtemp = &(((Parser *) parser)->m_mem);
    mtemp->malloc_fcn = memsuite->malloc_fcn;
    mtemp->realloc_fcn = memsuite->realloc_fcn;
    mtemp->free_fcn = memsuite->free_fcn;
  }
  else {
    XML_Memory_Handling_Suite *mtemp;
    parser = malloc(sizeof(Parser));
    mtemp = &(((Parser *) parser)->m_mem);
    mtemp->malloc_fcn = malloc;
    mtemp->realloc_fcn = realloc;
    mtemp->free_fcn = free;
  }

  if (!parser)
    return parser;
  processor = prologInitProcessor;
  XmlPrologStateInit(&prologState);
  userData = 0;
  handlerArg = 0;
  startElementHandler = 0;
  endElementHandler = 0;
  characterDataHandler = 0;
  processingInstructionHandler = 0;
  commentHandler = 0;
  startCdataSectionHandler = 0;
  endCdataSectionHandler = 0;
  defaultHandler = 0;
  startDoctypeDeclHandler = 0;
  endDoctypeDeclHandler = 0;
  unparsedEntityDeclHandler = 0;
  notationDeclHandler = 0;
  startNamespaceDeclHandler = 0;
  endNamespaceDeclHandler = 0;
  notStandaloneHandler = 0;
  externalEntityRefHandler = 0;
  externalEntityRefHandlerArg = parser;
  unknownEncodingHandler = 0;
  elementDeclHandler = 0;
  attlistDeclHandler = 0;
  entityDeclHandler = 0;
  xmlDeclHandler = 0;
  buffer = 0;
  bufferPtr = 0;
  bufferEnd = 0;
  parseEndByteIndex = 0;
  parseEndPtr = 0;
  bufferLim = 0;
  declElementType = 0;
  declAttributeId = 0;
  declEntity = 0;
  doctypeName = 0;
  doctypeSysid = 0;
  doctypePubid = 0;
  declAttributeType = 0;
  declNotationName = 0;
  declNotationPublicId = 0;
  memset(&position, 0, sizeof(POSITION));
  errorCode = XML_ERROR_NONE;
  eventPtr = 0;
  eventEndPtr = 0;
  positionPtr = 0;
  openInternalEntities = 0;
  tagLevel = 0;
  tagStack = 0;
  freeTagList = 0;
  freeBindingList = 0;
  inheritedBindings = 0;
  attsSize = INIT_ATTS_SIZE;
  atts = MALLOC(attsSize * sizeof(ATTRIBUTE));
  nSpecifiedAtts = 0;
  dataBuf = MALLOC(INIT_DATA_BUF_SIZE * sizeof(XML_Char));
  groupSize = 0;
  groupConnector = 0;
  hadExternalDoctype = 0;
  unknownEncodingMem = 0;
  unknownEncodingRelease = 0;
  unknownEncodingData = 0;
  unknownEncodingHandlerData = 0;
  namespaceSeparator = '!';
#ifdef XML_DTD
  parentParser = 0;
  paramEntityParsing = XML_PARAM_ENTITY_PARSING_NEVER;
#endif
  ns = 0;
  ns_triplets = 0;
  poolInit(&tempPool, &(((Parser *) parser)->m_mem));
  poolInit(&temp2Pool, &(((Parser *) parser)->m_mem));
  protocolEncodingName = encodingName ? poolCopyString(&tempPool, encodingName) : 0;
  curBase = 0;
  if (!dtdInit(&dtd, parser) || !atts || !dataBuf
      || (encodingName && !protocolEncodingName)) {
    XML_ParserFree(parser);
    return 0;
  }
  dataBufEnd = dataBuf + INIT_DATA_BUF_SIZE;

  if (nameSep) {
    XmlInitEncodingNS(&initEncoding, &encoding, 0);
    ns = 1;
    internalEncoding = XmlGetInternalEncodingNS();
    namespaceSeparator = *nameSep;

    if (! setContext(parser, implicitContext)) {
      XML_ParserFree(parser);
      return 0;
    }
  }
  else {
    XmlInitEncoding(&initEncoding, &encoding, 0);
    internalEncoding = XmlGetInternalEncoding();
  }

  return parser;
}